

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  ostream *poVar5;
  char *pcVar6;
  bool bVar7;
  AssertionStats *pAVar8;
  pointer pMVar9;
  Colour colourGuard_3;
  Colour colourGuard_1;
  ConsoleAssertionPrinter printer;
  Colour colourGuard;
  char local_129;
  undefined1 local_128 [32];
  size_t local_108;
  ostream *local_f8;
  AssertionStats *local_f0;
  AssertionResult *local_e8;
  Code local_e0;
  char *local_d8;
  char *local_d0;
  char local_c8;
  undefined7 uStack_c7;
  char *local_b8;
  char *local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98 [2];
  long local_88 [2];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_78;
  byte local_60;
  string local_58;
  ConsoleReporter *local_38;
  
  pAVar8 = _assertionStats;
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_60 = 1;
  if ((char)iVar3 == '\0') {
    local_60 = ((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
               (byte)(char)(_assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  bVar7 = (bool)((_assertionStats->assertionResult).m_resultData.resultType == Warning | local_60);
  if (bVar7 != true) {
    return bVar7;
  }
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,(int)pAVar8)
  ;
  lazyPrintWithoutClosingBenchmarkTable(this);
  local_f8 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  local_d8 = &local_c8;
  local_e0 = None;
  local_d0 = (char *)0x0;
  local_c8 = '\0';
  local_b8 = &local_a8;
  local_b0 = (char *)0x0;
  local_a8 = '\0';
  local_98[0] = local_88;
  pcVar2 = (_assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_f0 = _assertionStats;
  local_e8 = &_assertionStats->assertionResult;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar2,
             pcVar2 + (_assertionStats->assertionResult).m_resultData.message._M_string_length);
  local_38 = this;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_78,&_assertionStats->infoMessages);
  OVar1 = (local_e8->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 != ExplicitFailure) {
        if (OVar1 != Exception) goto LAB_007ee816;
        goto switchD_007ee4c8_caseD_ffffffff;
      }
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x96fa09);
      local_e0 = BrightRed;
      if ((long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x97015d);
      }
      if ((ulong)(((long)(_assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(_assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2)
      goto LAB_007ee816;
      pcVar6 = "explicitly with messages";
    }
    else {
      if (OVar1 == ThrewException) {
        local_e0 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x96fa09);
        std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x9700e5);
        if ((long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x48) {
          std::__cxx11::string::append((char *)&local_b8);
        }
        if (1 < (ulong)(((long)(_assertionStats->infoMessages).
                               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(_assertionStats->infoMessages).
                               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7
                       )) {
          std::__cxx11::string::append((char *)&local_b8);
        }
        goto LAB_007ee816;
      }
      if (OVar1 == DidntThrowException) {
        local_e0 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x96fa09);
        pcVar6 = "because no exception was thrown where one was expected";
      }
      else {
        if (OVar1 != FatalErrorCondition) goto LAB_007ee816;
        local_e0 = BrightRed;
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x96fa09);
        pcVar6 = "due to a fatal error condition";
      }
    }
    goto LAB_007ee804;
  }
  switch(OVar1) {
  case Ok:
    local_e0 = Green;
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x9700ca);
    if ((long)(_assertionStats->infoMessages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(_assertionStats->infoMessages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_start == 0x48) {
      std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x970168);
    }
LAB_007ee619:
    if ((ulong)(((long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(_assertionStats->infoMessages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2)
    goto LAB_007ee816;
    pcVar6 = "with messages";
    break;
  case Info:
    pcVar6 = "info";
    break;
  case Warning:
    pcVar6 = "warning";
    break;
  case Unknown:
    goto switchD_007ee4c8_caseD_ffffffff;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) goto LAB_007ee816;
      bVar7 = (char)(((local_e8->m_info).resultDisposition & SuppressFail) >> 3) != '\0';
      local_e0 = BrightRed;
      if (bVar7) {
        local_e0 = Green;
      }
      pcVar6 = "FAILED";
      if (bVar7) {
        pcVar6 = "FAILED - but was ok";
      }
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,(ulong)pcVar6);
      if ((long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(_assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start == 0x48) {
        std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x970168);
      }
      goto LAB_007ee619;
    }
    goto switchD_007ee4c8_caseD_ffffffff;
  }
LAB_007ee804:
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,(ulong)pcVar6);
LAB_007ee816:
  local_58._M_dataplus._M_p._0_1_ = 0;
  Colour::use(FileName);
  poVar5 = local_f8;
  local_128._0_8_ = (local_e8->m_info).lineInfo.file;
  local_128._8_8_ = (local_e8->m_info).lineInfo.line;
  Catch::operator<<(local_f8,(SourceLineInfo *)local_128);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,": ",2);
  Colour::use(None);
  if ((local_f0->totals).assertions.failed + (local_f0->totals).assertions.passed +
      (local_f0->totals).assertions.failedButOk == 0) {
    local_128[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f8,local_128,1);
  }
  else {
    if (local_d0 != (char *)0x0) {
      local_128._0_8_ = (ulong)(uint7)local_128._1_7_ << 8;
      Colour::use(local_e0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_f8,local_d8,(long)local_d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
      Colour::use(None);
    }
    if ((local_e8->m_info).capturedExpression.m_size != 0) {
      local_58._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Cyan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f8,"  ",2);
      poVar5 = local_f8;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_128,local_e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar5,(char *)local_128._0_8_,local_128._8_8_);
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      local_128[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f8,local_128,1);
      Colour::use(None);
    }
    bVar7 = AssertionResult::hasExpandedExpression(local_e8);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8,"with expansion:\n",0x10);
      Colour::use(BrightYellow);
      poVar5 = local_f8;
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_58,local_e8);
      clara::TextFlow::Column::Column((Column *)local_128,&local_58);
      local_108 = 2;
      poVar5 = clara::TextFlow::operator<<(poVar5,(Column *)local_128);
      local_129 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,&local_129,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  if (local_b0 != (char *)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_f8,local_b8,(long)local_b0);
    local_128[0] = ':';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_128,1);
    local_128[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_128,1);
  }
  if (local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar9 = local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar5 = local_f8;
      if ((local_60 != 0) || (pMVar9->type != Info)) {
        clara::TextFlow::Column::Column((Column *)local_128,&pMVar9->message);
        local_108 = 2;
        poVar5 = clara::TextFlow::operator<<(poVar5,(Column *)local_128);
        local_58._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,(char *)&local_58,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != local_78.
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_128[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
             local_128,1);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_78);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return true;
switchD_007ee4c8_caseD_ffffffff:
  std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x96ffb4);
  local_e0 = BrightRed;
  goto LAB_007ee816;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << '\n';
    return true;
}